

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O3

bool __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
CharacterEscape<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
          (GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
          *ds,uint *escapedCodepoint)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  
  uVar3 = ds->codepoint_;
  if (uVar3 == 0) {
    return false;
  }
  bVar2 = UTF8<char>::Decode<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                    (ds->ss_,&ds->codepoint_);
  if (!bVar2) {
    ds->codepoint_ = 0;
  }
  uVar1 = uVar3 - 0x28;
  if (uVar1 < 0x3f) {
    if ((0x7800000080004fU >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
      if ((ulong)uVar1 != 0x3e) goto LAB_001243a7;
      uVar3 = 0xc;
    }
  }
  else {
LAB_001243a7:
    bVar2 = false;
    switch(uVar3) {
    case 0x6e:
      uVar3 = 10;
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x75:
    case 0x77:
    case 0x78:
    case 0x79:
    case 0x7a:
      goto switchD_001243c0_caseD_6f;
    case 0x72:
      uVar3 = 0xd;
      break;
    case 0x74:
      uVar3 = 9;
      break;
    case 0x76:
      uVar3 = 0xb;
      break;
    case 0x7b:
    case 0x7c:
    case 0x7d:
      break;
    default:
      if (uVar3 != 0x24) {
        return false;
      }
    }
  }
  *escapedCodepoint = uVar3;
  bVar2 = true;
switchD_001243c0_caseD_6f:
  return bVar2;
}

Assistant:

unsigned Take() {
        unsigned c = codepoint_;
        if (c) // No further decoding when '\0'
            Decode();
        return c;
    }